

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getPageNormal(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  PCache *pPVar1;
  int iVar2;
  ulong in_RAX;
  sqlite3_pcache_page *pPage;
  PgHdr *pPVar3;
  u32 iFrame_00;
  PgHdr **ppPVar4;
  ulong uStack_38;
  u32 iFrame;
  
  if (pgno == 0) {
    iVar2 = sqlite3CorruptError(0xce7a);
    return iVar2;
  }
  uStack_38 = in_RAX;
  pPage = (*sqlite3Config.pcache2.xFetch)(pPager->pPCache->pCache,pgno,pPager->pPCache->eCreate & 3)
  ;
  if (pPage == (sqlite3_pcache_page *)0x0) {
    pPVar1 = pPager->pPCache;
    iVar2 = 7;
    if (pPVar1->eCreate == '\x02') goto LAB_002235e4;
    iVar2 = (*sqlite3Config.pcache2.xPagecount)(pPVar1->pCache);
    if (pPVar1->szSpill < iVar2) {
      ppPVar4 = &pPVar1->pSynced;
      while (pPVar3 = *ppPVar4, pPVar3 != (PgHdr *)0x0) {
        if ((pPVar3->nRef == 0) && ((pPVar3->flags & 8) == 0)) {
          pPVar1->pSynced = pPVar3;
          goto LAB_002236d6;
        }
        ppPVar4 = &pPVar3->pDirtyPrev;
      }
      pPVar1->pSynced = (PgHdr *)0x0;
      ppPVar4 = &pPVar1->pDirtyTail;
      while (pPVar3 = *ppPVar4, pPVar3 != (PgHdr *)0x0) {
        if (pPVar3->nRef == 0) goto LAB_002236d6;
        ppPVar4 = &pPVar3->pDirtyPrev;
      }
    }
    goto LAB_002236f0;
  }
LAB_00223527:
  pPVar3 = sqlite3PcacheFetchFinish(pPager->pPCache,pgno,pPage);
  *ppPage = pPVar3;
  if (((flags & 1U) == 0) && (pPVar3->pPager != (Pager *)0x0)) {
    pPager->aStat[0] = pPager->aStat[0] + 1;
    return 0;
  }
  if (((int)pgno < 0) || (sqlite3PendingByte / pPager->pageSize + 1U == pgno)) {
    iVar2 = sqlite3CorruptError(0xce9a);
  }
  else {
    pPVar3->pPager = pPager;
    if (((pPager->fd->pMethods == (sqlite3_io_methods *)0x0) || ((flags & 1U) != 0)) ||
       (pPager->dbSize < pgno)) {
      if (pgno <= pPager->mxPgno) {
        if ((flags & 1U) != 0) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          if (pgno <= pPager->dbOrigSize) {
            sqlite3BitvecSet(pPager->pInJournal,pgno);
          }
          addToSavepointBitvecs(pPager,pgno);
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
        }
        memset(pPVar3->pData,0,(long)pPager->pageSize);
        return 0;
      }
      iVar2 = 0xd;
    }
    else {
      uStack_38 = uStack_38 & 0xffffffff;
      if (pPager->pWal == (Wal *)0x0) {
        iFrame_00 = 0;
      }
      else {
        iVar2 = sqlite3WalFindFrame(pPager->pWal,pgno,&iFrame);
        if (iVar2 != 0) goto LAB_002235dc;
        iFrame_00 = iFrame;
      }
      pPager->aStat[1] = pPager->aStat[1] + 1;
      iVar2 = readDbPage(pPVar3,iFrame_00);
      if (iVar2 == 0) {
        return 0;
      }
    }
  }
LAB_002235dc:
  sqlite3PcacheDrop(pPVar3);
LAB_002235e4:
  pagerUnlockIfUnused(pPager);
  *ppPage = (DbPage *)0x0;
  return iVar2;
LAB_002236d6:
  iVar2 = (*pPVar1->xStress)(pPVar1->pStress,pPVar3);
  if ((iVar2 != 5) && (iVar2 != 0)) goto LAB_002235e4;
LAB_002236f0:
  pPage = (*sqlite3Config.pcache2.xFetch)(pPVar1->pCache,pgno,2);
  iVar2 = 7;
  if (pPage == (sqlite3_pcache_page *)0x0) goto LAB_002235e4;
  goto LAB_00223527;
}

Assistant:

static int getPageNormal(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg;
  u8 noContent;                   /* True if PAGER_GET_NOCONTENT is set */
  sqlite3_pcache_page *pBase;

  assert( pPager->errCode==SQLITE_OK );
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );

  if( pgno==0 ) return SQLITE_CORRUPT_BKPT;
  pBase = sqlite3PcacheFetch(pPager->pPCache, pgno, 3);
  if( pBase==0 ){
    pPg = 0;
    rc = sqlite3PcacheFetchStress(pPager->pPCache, pgno, &pBase);
    if( rc!=SQLITE_OK ) goto pager_acquire_err;
    if( pBase==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto pager_acquire_err;
    }
  }
  pPg = *ppPage = sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pBase);
  assert( pPg==(*ppPage) );
  assert( pPg->pgno==pgno );
  assert( pPg->pPager==pPager || pPg->pPager==0 );

  noContent = (flags & PAGER_GET_NOCONTENT)!=0;
  if( pPg->pPager && !noContent ){
    /* In this case the pcache already contains an initialized copy of
    ** the page. Return without further ado.  */
    assert( pgno<=PAGER_MAX_PGNO && pgno!=PAGER_MJ_PGNO(pPager) );
    pPager->aStat[PAGER_STAT_HIT]++;
    return SQLITE_OK;

  }else{
    /* The pager cache has created a new page. Its content needs to 
    ** be initialized. But first some error checks:
    **
    ** (1) The maximum page number is 2^31
    ** (2) Never try to fetch the locking page
    */
    if( pgno>PAGER_MAX_PGNO || pgno==PAGER_MJ_PGNO(pPager) ){
      rc = SQLITE_CORRUPT_BKPT;
      goto pager_acquire_err;
    }

    pPg->pPager = pPager;

    assert( !isOpen(pPager->fd) || !MEMDB );
    if( !isOpen(pPager->fd) || pPager->dbSize<pgno || noContent ){
      if( pgno>pPager->mxPgno ){
        rc = SQLITE_FULL;
        goto pager_acquire_err;
      }
      if( noContent ){
        /* Failure to set the bits in the InJournal bit-vectors is benign.
        ** It merely means that we might do some extra work to journal a 
        ** page that does not need to be journaled.  Nevertheless, be sure 
        ** to test the case where a malloc error occurs while trying to set 
        ** a bit in a bit vector.
        */
        sqlite3BeginBenignMalloc();
        if( pgno<=pPager->dbOrigSize ){
          TESTONLY( rc = ) sqlite3BitvecSet(pPager->pInJournal, pgno);
          testcase( rc==SQLITE_NOMEM );
        }
        TESTONLY( rc = ) addToSavepointBitvecs(pPager, pgno);
        testcase( rc==SQLITE_NOMEM );
        sqlite3EndBenignMalloc();
      }
      memset(pPg->pData, 0, pPager->pageSize);
      IOTRACE(("ZERO %p %d\n", pPager, pgno));
    }else{
      u32 iFrame = 0;                 /* Frame to read from WAL file */
      if( pagerUseWal(pPager) ){
        rc = sqlite3WalFindFrame(pPager->pWal, pgno, &iFrame);
        if( rc!=SQLITE_OK ) goto pager_acquire_err;
      }
      assert( pPg->pPager==pPager );
      pPager->aStat[PAGER_STAT_MISS]++;
      rc = readDbPage(pPg, iFrame);
      if( rc!=SQLITE_OK ){
        goto pager_acquire_err;
      }
    }
    pager_set_pagehash(pPg);
  }
  return SQLITE_OK;

pager_acquire_err:
  assert( rc!=SQLITE_OK );
  if( pPg ){
    sqlite3PcacheDrop(pPg);
  }
  pagerUnlockIfUnused(pPager);
  *ppPage = 0;
  return rc;
}